

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawMesh
          (VulkanCommandBuffer *this,uint32_t TaskCountX,uint32_t TaskCountY,uint32_t TaskCountZ)

{
  undefined4 in_register_0000000c;
  string msg;
  string local_48;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,TaskCountZ));
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (((this->m_State).RenderPass == (VkRenderPass)0x0) &&
     ((this->m_State).DynamicRenderingHash == 0)) {
    Diligent::FormatString<char[58]>
              (&local_48,(char (*) [58])"vkCmdDrawMeshTasksEXT() must be called inside render pass")
    ;
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>(&local_48,(char (*) [27])"No graphics pipeline bound");
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)&local_48);
  }
  (*vkCmdDrawMeshTasksEXT)(this->m_VkCmdBuffer,TaskCountX,TaskCountY,TaskCountZ);
  return;
}

Assistant:

__forceinline void DrawMesh(uint32_t TaskCountX, uint32_t TaskCountY, uint32_t TaskCountZ)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(), "vkCmdDrawMeshTasksEXT() must be called inside render pass");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDrawMeshTasksEXT(m_VkCmdBuffer, TaskCountX, TaskCountY, TaskCountZ);
#else
        UNSUPPORTED("DrawMesh is not supported when vulkan library is linked statically");
#endif
    }